

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O2

void chacha20poly1305_init(ptls_aead_context_t *_ctx,uint64_t seq,void *aad,size_t aadlen)

{
  size_t sVar1;
  void *extraout_RDX;
  uint8_t tmpbuf [64];
  
  tmpbuf._0_8_ = tmpbuf._0_8_ & 0xffffffff00000000;
  ptls_aead__build_iv(_ctx->algo,tmpbuf + 4,(uint8_t *)&_ctx[1].dispose_crypto,seq);
  (*(code *)(_ctx[1].algo)->integrity_limit)(_ctx[1].algo,tmpbuf);
  tmpbuf[0x30] = '\0';
  tmpbuf[0x31] = '\0';
  tmpbuf[0x32] = '\0';
  tmpbuf[0x33] = '\0';
  tmpbuf[0x34] = '\0';
  tmpbuf[0x35] = '\0';
  tmpbuf[0x36] = '\0';
  tmpbuf[0x37] = '\0';
  tmpbuf[0x38] = '\0';
  tmpbuf[0x39] = '\0';
  tmpbuf[0x3a] = '\0';
  tmpbuf[0x3b] = '\0';
  tmpbuf[0x3c] = '\0';
  tmpbuf[0x3d] = '\0';
  tmpbuf[0x3e] = '\0';
  tmpbuf[0x3f] = '\0';
  tmpbuf[0x20] = '\0';
  tmpbuf[0x21] = '\0';
  tmpbuf[0x22] = '\0';
  tmpbuf[0x23] = '\0';
  tmpbuf[0x24] = '\0';
  tmpbuf[0x25] = '\0';
  tmpbuf[0x26] = '\0';
  tmpbuf[0x27] = '\0';
  tmpbuf[0x28] = '\0';
  tmpbuf[0x29] = '\0';
  tmpbuf[0x2a] = '\0';
  tmpbuf[0x2b] = '\0';
  tmpbuf[0x2c] = '\0';
  tmpbuf[0x2d] = '\0';
  tmpbuf[0x2e] = '\0';
  tmpbuf[0x2f] = '\0';
  tmpbuf[0x10] = '\0';
  tmpbuf[0x11] = '\0';
  tmpbuf[0x12] = '\0';
  tmpbuf[0x13] = '\0';
  tmpbuf[0x14] = '\0';
  tmpbuf[0x15] = '\0';
  tmpbuf[0x16] = '\0';
  tmpbuf[0x17] = '\0';
  tmpbuf[0x18] = '\0';
  tmpbuf[0x19] = '\0';
  tmpbuf[0x1a] = '\0';
  tmpbuf[0x1b] = '\0';
  tmpbuf[0x1c] = '\0';
  tmpbuf[0x1d] = '\0';
  tmpbuf[0x1e] = '\0';
  tmpbuf[0x1f] = '\0';
  tmpbuf[0] = '\0';
  tmpbuf[1] = '\0';
  tmpbuf[2] = '\0';
  tmpbuf[3] = '\0';
  tmpbuf[4] = '\0';
  tmpbuf[5] = '\0';
  tmpbuf[6] = '\0';
  tmpbuf[7] = '\0';
  tmpbuf[8] = '\0';
  tmpbuf[9] = '\0';
  tmpbuf[10] = '\0';
  tmpbuf[0xb] = '\0';
  tmpbuf[0xc] = '\0';
  tmpbuf[0xd] = '\0';
  tmpbuf[0xe] = '\0';
  tmpbuf[0xf] = '\0';
  sVar1 = 0x40;
  (*(code *)(_ctx[1].algo)->ctr_cipher)(_ctx[1].algo,tmpbuf,tmpbuf);
  (*_ctx[1].do_encrypt_update)(_ctx,tmpbuf,extraout_RDX,sVar1);
  (*ptls_clear_memory)(tmpbuf,0x40);
  if (aadlen != 0) {
    (*_ctx[1].do_encrypt_final)(_ctx,aad);
    chacha20poly1305_encrypt_pad((chacha20poly1305_context_t *)_ctx,aadlen);
  }
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)aadlen;
  _ctx[1].do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
  return;
}

Assistant:

static void chacha20poly1305_init(ptls_aead_context_t *_ctx, uint64_t seq, const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tmpbuf[CHACHA20POLY1305_BLOCKSIZE];

    /* init chacha */
    memset(tmpbuf, 0, 16 - PTLS_CHACHA20POLY1305_IV_SIZE);
    ptls_aead__build_iv(ctx->super.algo, tmpbuf + 16 - PTLS_CHACHA20POLY1305_IV_SIZE, ctx->static_iv, seq);
    ptls_cipher_init(ctx->chacha, tmpbuf);

    /* init poly1305 */
    memset(tmpbuf, 0, sizeof(tmpbuf));
    ptls_cipher_encrypt(ctx->chacha, tmpbuf, tmpbuf, CHACHA20POLY1305_BLOCKSIZE);
    ctx->poly1305_init(ctx, tmpbuf);

    ptls_clear_memory(tmpbuf, sizeof(tmpbuf));

    /* aad */
    if (aadlen != 0) {
        ctx->poly1305_update(ctx, aad, aadlen);
        chacha20poly1305_encrypt_pad(ctx, aadlen);
    }

    ctx->aadlen = aadlen;
    ctx->textlen = 0;
}